

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c0_compile_symbol.cpp
# Opt level: O2

compile_errcode __thiscall
SymbolTableTree::GetTermKind
          (SymbolTableTree *this,string *begin_func_name,string *name,SymbolKind *kind)

{
  __type _Var1;
  bool bVar2;
  compile_errcode cVar3;
  pointer __lhs;
  string cur_func_name;
  string local_50 [32];
  
  std::__cxx11::string::string((string *)&cur_func_name,(string *)begin_func_name);
  do {
    for (__lhs = (this->m_table_tree).
                 super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SymbolTable>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SymbolTable>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        __lhs != (this->m_table_tree).
                 super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SymbolTable>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SymbolTable>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish; __lhs = __lhs + 1) {
      _Var1 = std::operator==(&__lhs->first,&cur_func_name);
      if (_Var1) break;
    }
    cVar3 = SymbolTable::GetTermKind(&__lhs->second,name,kind);
    if (cVar3 == 0) {
      cVar3 = 0;
      goto LAB_001326ee;
    }
    std::__cxx11::string::string(local_50,(string *)&(__lhs->second).m_previous_level_name);
    std::__cxx11::string::operator=((string *)&cur_func_name,local_50);
    std::__cxx11::string::~string(local_50);
    bVar2 = std::operator!=(&cur_func_name,&this->m_BOTTOM_LEVEL);
    if (!bVar2) {
      fprintf(_stderr,"(kind)no match term name: %s---%s\n",(begin_func_name->_M_dataplus)._M_p,
              (name->_M_dataplus)._M_p);
      cVar3 = -3;
LAB_001326ee:
      std::__cxx11::string::~string((string *)&cur_func_name);
      return cVar3;
    }
  } while( true );
}

Assistant:

compile_errcode SymbolTableTree::GetTermKind(const string& begin_func_name, const string& name, SymbolKind& kind) {
    int ret = COMPILE_OK;
    string cur_func_name = begin_func_name;
    do {
        auto iter = m_table_tree.begin(); 
        for (; iter != m_table_tree.end(); ++iter) {
            if (iter->first == cur_func_name) {
                break;
            }
        }
        if ((ret = iter->second.GetTermKind(name, kind)) != COMPILE_OK) {
            cur_func_name = iter->second.GetPreviousTableName();
        } else {
            return COMPILE_OK;
        }
    } while(cur_func_name != m_BOTTOM_LEVEL);
    fprintf(stderr, "(kind)no match term name: %s---%s\n", begin_func_name.c_str(), name.c_str());
    return NOT_FIND_TERM;
}